

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idas_bbdpre.c
# Opt level: O3

int IDAAgcomm(sunindextype NlocalB,sunrealtype tt,N_Vector yyB,N_Vector ypB,void *ida_mem)

{
  long lVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  code *UNRECOVERED_JUMPTABLE;
  
  lVar1 = *(long *)((long)ida_mem + 0x840);
  lVar2 = *(long *)(lVar1 + 0x40);
  lVar3 = *(long *)(lVar2 + 0x58);
  UNRECOVERED_JUMPTABLE = *(code **)(lVar3 + 8);
  if (UNRECOVERED_JUMPTABLE == (code *)0x0) {
    return 0;
  }
  if (*(int *)(lVar1 + 0xc0) == 0) {
    iVar4 = (**(code **)(lVar1 + 0x98))
                      (ida_mem,*(undefined8 *)(lVar1 + 0x158),*(undefined8 *)(lVar1 + 0x160),0,0);
    if (iVar4 != 0) {
      IDAProcessError((IDAMem)ida_mem,-1,0x3b1,"IDAAgcomm",
                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idas_bbdpre.c"
                      ,"Bad t for interpolation.");
      return -1;
    }
    UNRECOVERED_JUMPTABLE = *(code **)(lVar3 + 8);
  }
  iVar4 = (*UNRECOVERED_JUMPTABLE)
                    (tt,NlocalB,*(undefined8 *)(lVar1 + 0x158),*(undefined8 *)(lVar1 + 0x160),yyB,
                     ypB,*(undefined8 *)(lVar2 + 0x40));
  return iVar4;
}

Assistant:

static int IDAAgcomm(sunindextype NlocalB, sunrealtype tt, N_Vector yyB,
                     N_Vector ypB, void* ida_mem)
{
  IDAMem IDA_mem;
  IDAadjMem IDAADJ_mem;
  IDABMem IDAB_mem;
  IDABBDPrecDataB idabbdB_mem;
  int flag;

  IDA_mem    = (IDAMem)ida_mem;
  IDAADJ_mem = IDA_mem->ida_adj_mem;

  /* Get current backward problem. */
  IDAB_mem = IDAADJ_mem->ia_bckpbCrt;

  /* Get the preconditioner's memory. */
  idabbdB_mem = (IDABBDPrecDataB)IDAB_mem->ida_pmem;
  if (idabbdB_mem->gcommB == NULL) { return (0); }

  /* Get forward solution from interpolation. */
  if (IDAADJ_mem->ia_noInterp == SUNFALSE)
  {
    flag = IDAADJ_mem->ia_getY(IDA_mem, tt, IDAADJ_mem->ia_yyTmp,
                               IDAADJ_mem->ia_ypTmp, NULL, NULL);
    if (flag != IDA_SUCCESS)
    {
      IDAProcessError(IDA_mem, -1, __LINE__, __func__, __FILE__, MSGBBD_BAD_T);
      return (-1);
    }
  }

  /* Call user's adjoint CommFnB routine */
  return idabbdB_mem->gcommB(NlocalB, tt, IDAADJ_mem->ia_yyTmp,
                             IDAADJ_mem->ia_ypTmp, yyB, ypB,
                             IDAB_mem->ida_user_data);
}